

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflection_IsDescendantOneof_Test::
~GeneratedMessageReflection_IsDescendantOneof_Test
          (GeneratedMessageReflection_IsDescendantOneof_Test *this)

{
  GeneratedMessageReflection_IsDescendantOneof_Test *this_local;
  
  ~GeneratedMessageReflection_IsDescendantOneof_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflection, IsDescendantOneof) {
  unittest::TestOneof msg1, msg2;
  TestUtil::SetAllFields(msg1.mutable_foo_message());
  msg2 = msg1;

  EXPECT_TRUE(IsDescendant(msg1, msg1.foo_message().optional_nested_message()));
  EXPECT_TRUE(
      IsDescendant(msg1, msg1.foo_message().repeated_foreign_message(0)));

  EXPECT_FALSE(
      IsDescendant(msg1, msg2.foo_message().optional_nested_message()));
  EXPECT_FALSE(
      IsDescendant(msg1, msg2.foo_message().repeated_foreign_message(0)));
}